

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O2

string * __thiscall
kratos::InterfaceModPortDefinition::def_name_abi_cxx11_
          (string *__return_storage_ptr__,InterfaceModPortDefinition *this)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  string_view format_str;
  format_args args;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_48;
  undefined8 uStack_40;
  pointer local_38;
  size_type sStack_30;
  
  (*(((this->def_).super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->super_IDefinition)._vptr_IDefinition[7])(&local_68);
  local_38 = (this->name_)._M_dataplus._M_p;
  sStack_30 = (this->name_)._M_string_length;
  local_48 = local_68;
  uStack_40 = uStack_60;
  bVar1 = fmt::v7::to_string_view<char,_0>("{0}.{1}");
  format_str.data_ = (char *)bVar1.size_;
  format_str.size_ = 0xdd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_48;
  fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)bVar1.data_,format_str,args);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string InterfaceModPortDefinition::def_name() const {
    return ::format("{0}.{1}", def_->def_name(), name_);
}